

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZContBufferedStream.cpp
# Opt level: O0

void __thiscall
TPZContBufferedStream::WriteToBuffer(TPZContBufferedStream *this,char *source,size_t *nBytes)

{
  size_t sVar1;
  ulong uVar2;
  void *pvVar3;
  size_t *in_RDX;
  void *in_RSI;
  long *in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char *temp;
  size_t newAllocatedBytes;
  size_t oldSize;
  long local_20;
  size_t *local_18;
  void *local_10;
  
  local_18 = in_RDX;
  if ((ulong)in_RDI[4] < (in_RDI[2] - in_RDI[1]) + in_RDI[5] + *in_RDX) {
    local_20 = in_RDI[5];
    auVar5._8_4_ = (int)((ulong)local_20 >> 0x20);
    auVar5._0_8_ = local_20;
    auVar5._12_4_ = 0x45300000;
    sVar1 = *in_RDX;
    auVar6._8_4_ = (int)(sVar1 >> 0x20);
    auVar6._0_8_ = sVar1;
    auVar6._12_4_ = 0x45300000;
    dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0)) * 1.1 +
            (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) + 1.0;
    uVar2 = (ulong)dVar4;
    uVar2 = uVar2 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    local_10 = in_RSI;
    pvVar3 = operator_new__(uVar2);
    (**(code **)(*in_RDI + 0x1d8))(in_RDI,pvVar3,&local_20);
    memcpy((void *)((long)pvVar3 + local_20),local_10,*local_18);
    if ((void *)in_RDI[1] != (void *)0x0) {
      operator_delete__((void *)in_RDI[1]);
    }
    in_RDI[1] = (long)pvVar3;
    in_RDI[4] = uVar2;
    in_RDI[2] = in_RDI[1];
    in_RDI[5] = local_20 + *local_18;
    in_RDI[3] = in_RDI[1] + -1 + in_RDI[5];
  }
  else {
    memcpy((void *)(in_RDI[3] + 1),in_RSI,*in_RDX);
    in_RDI[3] = *local_18 + in_RDI[3];
    in_RDI[5] = *local_18 + in_RDI[5];
  }
  return;
}

Assistant:

void TPZContBufferedStream::WriteToBuffer(const char *source,
        const size_t &nBytes) {
    if (fFirst - fBuffer + fSize + nBytes > fNAllocatedBytes) {
        const size_t oldSize = fSize;
        const size_t newAllocatedBytes =
                oldSize * 1.1 + nBytes +
                MIN_SIZE_INCREMENT; // 10% increase + nBytes + MIN_SIZE_INCREMENT
        char *temp = new char[newAllocatedBytes];
        ConstReadFromBuffer(temp, oldSize);
        memcpy(temp + oldSize, source, nBytes);
        delete[] fBuffer;
        fBuffer = temp;
        fNAllocatedBytes = newAllocatedBytes;
        fFirst = fBuffer;
        fSize = oldSize + nBytes;
        fLast = fBuffer - 1 + fSize;
    } else {
        memcpy(fLast + 1, source, nBytes);
        fLast += nBytes;
        fSize += nBytes;
    }
}